

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_19bb9b::SwiftCompilerShellCommand::configureAttribute
          (SwiftCompilerShellCommand *this,ConfigureContext *ctx,StringRef name,StringRef value)

{
  bool bVar1;
  ConfigureContext *ctx_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  string *this_00;
  char *pcVar3;
  char *pcVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  StringRef Str;
  StringRef Separator;
  StringRef Separator_00;
  StringRef Separator_01;
  StringRef Separator_02;
  StringRef name_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __tmp;
  SmallVector<llvm::StringRef,_32U> args;
  undefined1 local_2a8 [16];
  pointer local_298;
  StringRef local_288;
  llvm *local_278;
  char *pcStack_270;
  llvm *local_268;
  char *pcStack_260;
  undefined1 local_258 [16];
  pointer local_248;
  Child local_240;
  ulong local_238;
  Child local_230 [64];
  
  name_00.Data = (char *)name.Length;
  local_288.Data = name.Data;
  pcVar4 = (char *)value.Length;
  name_00.Length = (llvm *)value.Data;
  pcVar3 = name_00.Data + -7;
  local_2a8 = (undefined1  [16])value;
  local_288.Length = (size_t)name_00.Data;
  switch(pcVar3) {
  case (char *)0x0:
switchD_00146591_caseD_0:
    if (*(int *)((bool *)local_288.Data + 3) == 0x73656372 && *(int *)local_288.Data == 0x72756f73)
    {
      local_240.twine = (Twine *)local_230;
      local_238 = 0x2000000000;
      Separator_00.Length = 1;
      Separator_00.Data = " ";
      llvm::StringRef::split
                ((StringRef *)local_2a8,(SmallVectorImpl<llvm::StringRef> *)&local_240,Separator_00,
                 -1,false);
      local_258 = (undefined1  [16])0x0;
      local_248 = (pointer)0x0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<llvm::StringRef*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258,
                 local_240.twine,&(local_240.twine)->LHS + (local_238 & 0xffffffff) * 2);
      local_2a8._0_8_ =
           (this->sourcesList).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_2a8._8_8_ =
           (this->sourcesList).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_298 = (this->sourcesList).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (this->sourcesList).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_258._0_8_;
      (this->sourcesList).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_258._8_8_;
      (this->sourcesList).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_248;
LAB_00146978:
      this_01 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_258;
      local_258 = ZEXT816(0);
      local_248 = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2a8);
      goto LAB_00146b16;
    }
    switch(pcVar3) {
    case (char *)0x0:
      if (*(int *)((bool *)local_288.Data + 3) == 0x73746365 && *(int *)local_288.Data == 0x656a626f
         ) {
        local_240.twine = (Twine *)local_230;
        local_238 = 0x2000000000;
        Separator_02.Length = 1;
        Separator_02.Data = " ";
        llvm::StringRef::split
                  ((StringRef *)local_2a8,(SmallVectorImpl<llvm::StringRef> *)&local_240,
                   Separator_02,-1,false);
        local_258 = (undefined1  [16])0x0;
        local_248 = (pointer)0x0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_initialize<llvm::StringRef*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258,
                   local_240.twine,&(local_240.twine)->LHS + (local_238 & 0xffffffff) * 2);
        local_2a8._0_8_ =
             (this->objectsList).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_2a8._8_8_ =
             (this->objectsList).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_298 = (this->objectsList).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (this->objectsList).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_258._0_8_;
        (this->objectsList).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_258._8_8_;
        (this->objectsList).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = local_248;
        goto LAB_00146978;
      }
      if (0xb < (long)name_00.Data) {
        if (name_00.Data != (char *)0x20) {
          if (name_00.Data != (char *)0xc) goto switchD_00146591_caseD_1;
          break;
        }
        goto LAB_00146763;
      }
      if (name_00.Data == (char *)0xa) goto switchD_001466b5_caseD_3;
      goto LAB_00146795;
    case (char *)0x1:
    case (char *)0x2:
      goto switchD_00146591_caseD_1;
    case (char *)0x3:
      goto switchD_001466b5_caseD_3;
    case (char *)0x4:
      goto switchD_001466b5_caseD_4;
    case (char *)0x5:
      break;
    default:
      goto switchD_00146591_default;
    }
  case (char *)0x1:
  case (char *)0x2:
  case (char *)0x6:
  case (char *)0x7:
  case (char *)0x8:
  case (char *)0x9:
  case (char *)0xa:
    goto switchD_00146591_caseD_1;
  case (char *)0x3:
    if (*(short *)((bool *)local_288.Data + 8) == 0x656c &&
        *(long *)local_288.Data == 0x6261747563657865) {
      local_240.twine = (Twine *)local_230;
      if (name_00.Length == (llvm *)0x0) {
        local_238 = 0;
        local_230[0].character = '\0';
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_240,name_00.Length,pcVar4 + (long)name_00.Length);
      }
      this_00 = (string *)&this->executable;
      goto LAB_00146d84;
    }
    switch(pcVar3) {
    case (char *)0x0:
      goto switchD_00146591_caseD_0;
    case (char *)0x1:
    case (char *)0x2:
    case (char *)0x6:
    case (char *)0x7:
    case (char *)0x8:
    case (char *)0x9:
    case (char *)0xa:
      goto switchD_00146591_caseD_1;
    case (char *)0x3:
      goto switchD_001466b5_caseD_3;
    case (char *)0x4:
      goto switchD_00146591_caseD_4;
    case (char *)0x5:
      break;
    case (char *)0xb:
      goto switchD_00146591_caseD_b;
    default:
      goto switchD_00146591_default;
    }
  case (char *)0x4:
switchD_00146591_caseD_4:
    if (*(long *)((bool *)local_288.Data + 3) == 0x656d616e2d656c75 &&
        *(long *)local_288.Data == 0x6e2d656c75646f6d) {
      local_240.twine = (Twine *)local_230;
      if (name_00.Length == (llvm *)0x0) {
        local_238 = 0;
        local_230[0].character = '\0';
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_240,name_00.Length,pcVar4 + (long)name_00.Length);
      }
      this_00 = (string *)&this->moduleName;
      goto LAB_00146d84;
    }
    switch(pcVar3) {
    case (char *)0x0:
      goto switchD_00146591_caseD_0;
    case (char *)0x1:
    case (char *)0x2:
    case (char *)0x6:
    case (char *)0x7:
    case (char *)0x8:
    case (char *)0x9:
    case (char *)0xa:
      goto switchD_00146591_caseD_1;
    case (char *)0x3:
      goto switchD_001466b5_caseD_3;
    case (char *)0x4:
      goto switchD_001466b5_caseD_4;
    case (char *)0x5:
      break;
    case (char *)0xb:
      goto switchD_00146591_caseD_b;
    default:
      goto switchD_00146591_default;
    }
  case (char *)0x5:
    break;
  case (char *)0xb:
switchD_00146591_caseD_b:
    auVar6[0] = -(*local_288.Data == 'm');
    auVar6[1] = -(((bool *)local_288.Data)[1] == (bool)'o');
    auVar6[2] = -(((bool *)local_288.Data)[2] == (bool)'d');
    auVar6[3] = -(((bool *)local_288.Data)[3] == (bool)'u');
    auVar6[4] = -(((bool *)local_288.Data)[4] == (bool)'l');
    auVar6[5] = -(((bool *)local_288.Data)[5] == (bool)'e');
    auVar6[6] = -(((bool *)local_288.Data)[6] == (bool)'-');
    auVar6[7] = -(((bool *)local_288.Data)[7] == (bool)'o');
    auVar6[8] = -(((bool *)local_288.Data)[8] == (bool)'u');
    auVar6[9] = -(((bool *)local_288.Data)[9] == (bool)'t');
    auVar6[10] = -(((bool *)local_288.Data)[10] == (bool)'p');
    auVar6[0xb] = -(((bool *)local_288.Data)[0xb] == (bool)'u');
    auVar6[0xc] = -(((bool *)local_288.Data)[0xc] == (bool)'t');
    auVar6[0xd] = -(((bool *)local_288.Data)[0xd] == (bool)'-');
    auVar6[0xe] = -(((bool *)local_288.Data)[0xe] == (bool)'p');
    auVar6[0xf] = -(((bool *)local_288.Data)[0xf] == (bool)'a');
    auVar8[0] = -((char)*(undefined2 *)((bool *)local_288.Data + 0x10) == 't');
    auVar8[1] = -((char)((ushort)*(undefined2 *)((bool *)local_288.Data + 0x10) >> 8) == 'h');
    auVar8[2] = 0xff;
    auVar8[3] = 0xff;
    auVar8[4] = 0xff;
    auVar8[5] = 0xff;
    auVar8[6] = 0xff;
    auVar8[7] = 0xff;
    auVar8[8] = 0xff;
    auVar8[9] = 0xff;
    auVar8[10] = 0xff;
    auVar8[0xb] = 0xff;
    auVar8[0xc] = 0xff;
    auVar8[0xd] = 0xff;
    auVar8[0xe] = 0xff;
    auVar8[0xf] = 0xff;
    auVar8 = auVar8 & auVar6;
    if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) == 0xffff) {
      local_240.twine = (Twine *)local_230;
      if (name_00.Length == (llvm *)0x0) {
        local_238 = 0;
        local_230[0].character = '\0';
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_240,name_00.Length,pcVar4 + (long)name_00.Length);
      }
      this_00 = (string *)&this->moduleOutputPath;
      goto LAB_00146d84;
    }
    switch(pcVar3) {
    case (char *)0x0:
      goto switchD_00146591_caseD_0;
    case (char *)0x1:
    case (char *)0x2:
      goto switchD_00146591_caseD_1;
    case (char *)0x3:
      goto switchD_001466b5_caseD_3;
    case (char *)0x4:
      goto switchD_001466b5_caseD_4;
    case (char *)0x5:
      break;
    default:
      goto switchD_00146591_default;
    }
  default:
switchD_00146591_default:
    if (name_00.Data != (char *)0x20) goto switchD_00146591_caseD_1;
    goto LAB_00146763;
  }
  if (*(int *)((bool *)local_288.Data + 8) == 0x73687461 &&
      *(long *)local_288.Data == 0x702d74726f706d69) {
    local_240.twine = (Twine *)local_230;
    local_238 = 0x2000000000;
    Separator.Length = 1;
    Separator.Data = " ";
    llvm::StringRef::split
              ((StringRef *)local_2a8,(SmallVectorImpl<llvm::StringRef> *)&local_240,Separator,-1,
               false);
    local_2a8._0_8_ = (char *)0x0;
    local_2a8._8_8_ = 0;
    local_298 = (pointer)0x0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<llvm::StringRef*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_2a8,
               local_240.twine,&(local_240.twine)->LHS + (local_238 & 0xffffffff) * 2);
    pvVar2 = &this->importPaths;
  }
  else {
    if (name_00.Data == (char *)0x20) {
LAB_00146763:
      auVar9[0] = -(((bool *)local_288.Data)[0x10] == true);
      auVar9[1] = -(((bool *)local_288.Data)[0x11] == true);
      auVar9[2] = -(((bool *)local_288.Data)[0x12] == true);
      auVar9[3] = -(((bool *)local_288.Data)[0x13] == true);
      auVar9[4] = -(((bool *)local_288.Data)[0x14] == true);
      auVar9[5] = -(((bool *)local_288.Data)[0x15] == true);
      auVar9[6] = -(((bool *)local_288.Data)[0x16] == true);
      auVar9[7] = -(((bool *)local_288.Data)[0x17] == true);
      auVar9[8] = -(((bool *)local_288.Data)[0x18] == true);
      auVar9[9] = -(((bool *)local_288.Data)[0x19] == true);
      auVar9[10] = -(((bool *)local_288.Data)[0x1a] == true);
      auVar9[0xb] = -(((bool *)local_288.Data)[0x1b] == true);
      auVar9[0xc] = -(((bool *)local_288.Data)[0x1c] == true);
      auVar9[0xd] = -(((bool *)local_288.Data)[0x1d] == true);
      auVar9[0xe] = -(((bool *)local_288.Data)[0x1e] == true);
      auVar9[0xf] = -(((bool *)local_288.Data)[0x1f] == true);
      auVar7[0] = -(*local_288.Data == 'e');
      auVar7[1] = -(((bool *)local_288.Data)[1] == true);
      auVar7[2] = -(((bool *)local_288.Data)[2] == true);
      auVar7[3] = -(((bool *)local_288.Data)[3] == true);
      auVar7[4] = -(((bool *)local_288.Data)[4] == true);
      auVar7[5] = -(((bool *)local_288.Data)[5] == true);
      auVar7[6] = -(((bool *)local_288.Data)[6] == true);
      auVar7[7] = -(((bool *)local_288.Data)[7] == true);
      auVar7[8] = -(((bool *)local_288.Data)[8] == true);
      auVar7[9] = -(((bool *)local_288.Data)[9] == true);
      auVar7[10] = -(((bool *)local_288.Data)[10] == true);
      auVar7[0xb] = -(((bool *)local_288.Data)[0xb] == true);
      auVar7[0xc] = -(((bool *)local_288.Data)[0xc] == true);
      auVar7[0xd] = -(((bool *)local_288.Data)[0xd] == true);
      auVar7[0xe] = -(((bool *)local_288.Data)[0xe] == true);
      auVar7[0xf] = -(((bool *)local_288.Data)[0xf] == true);
      auVar7 = auVar7 & auVar9;
      if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) == 0xffff) {
        ctx_00 = (ConfigureContext *)&this->enableWholeModuleOptimization;
        local_278 = name_00.Length;
        pcStack_270 = pcVar4;
LAB_001468a6:
        bVar1 = configureBool((SwiftCompilerShellCommand *)ctx,ctx_00,(bool *)local_288.Data,name_00
                              ,value);
        if (bVar1) {
          return true;
        }
        return false;
      }
      if (name_00.Data != (char *)0xa) {
LAB_00146795:
        if (name_00.Data != (char *)0xb) goto switchD_00146591_caseD_1;
        goto switchD_001466b5_caseD_4;
      }
    }
    else if (name_00.Data == (char *)0xb) {
switchD_001466b5_caseD_4:
      if (*(long *)((bool *)local_288.Data + 3) == 0x736461657268742d &&
          *(long *)local_288.Data == 0x657268742d6d756e) {
        Str.Length = 10;
        Str.Data = pcVar4;
        bVar1 = llvm::getAsSignedInteger
                          (name_00.Length,Str,(uint)&local_240,(longlong *)name_00.Length);
        if (bVar1) {
          bVar1 = true;
          bVar5 = false;
        }
        else {
          bVar5 = (Twine *)(long)local_240.decI == local_240.twine;
          bVar1 = !bVar5;
          bVar5 = local_240.decI < 0 && bVar5;
        }
        if (bVar1) {
          llvm::Twine::Twine((Twine *)local_2a8,"\'",&local_288);
          pcVar3 = "\' should be an int.";
        }
        else {
          if (!bVar5) {
            local_240.twine = (Twine *)local_230;
            if (name_00.Length == (llvm *)0x0) {
              local_238 = 0;
              local_230[0].character = '\0';
            }
            else {
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_240,name_00.Length,pcVar4 + (long)name_00.Length);
            }
            this_00 = (string *)&this->numThreads;
LAB_00146d84:
            std::__cxx11::string::operator=(this_00,(string *)&local_240.character);
            if (&(local_240.twine)->LHS == local_230) {
              return true;
            }
            operator_delete(local_240.twine,CONCAT71(local_230[0]._1_7_,local_230[0].character) + 1)
            ;
            return true;
          }
          llvm::Twine::Twine((Twine *)local_2a8,"\'",&local_288);
          pcVar3 = "\' should be greater than or equal to zero.";
        }
        llvm::Twine::Twine((Twine *)local_258,pcVar3);
        llvm::operator+((Twine *)&local_240,(Twine *)local_2a8,(Twine *)local_258);
        llbuild::buildsystem::ConfigureContext::error(ctx,(Twine *)&local_240);
        return false;
      }
      if (name_00.Data != (char *)0xa) goto switchD_00146591_caseD_1;
    }
    else {
      if (name_00.Data != (char *)0xa) goto switchD_00146591_caseD_1;
switchD_001466b5_caseD_3:
      if (*(short *)((bool *)local_288.Data + 8) == 0x6874 &&
          *(long *)local_288.Data == 0x61702d73706d6574) {
        local_240.twine = (Twine *)local_230;
        if (name_00.Length == (llvm *)0x0) {
          local_238 = 0;
          local_230[0].character = '\0';
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_240,name_00.Length,pcVar4 + (long)name_00.Length);
        }
        this_00 = (string *)&this->tempsPath;
        goto LAB_00146d84;
      }
      if (name_00.Data == (char *)0x20) goto LAB_00146763;
      if (name_00.Data == (char *)0xb) goto switchD_001466b5_caseD_4;
      if (name_00.Data != (char *)0xa) goto switchD_00146591_caseD_1;
      if (*(short *)((bool *)local_288.Data + 8) == 0x7972 &&
          *(long *)local_288.Data == 0x617262696c2d7369) {
        ctx_00 = (ConfigureContext *)&this->isLibrary;
        local_268 = name_00.Length;
        pcStack_260 = pcVar4;
        goto LAB_001468a6;
      }
    }
    if (*(short *)((bool *)local_288.Data + 8) != 0x7367 ||
        *(long *)local_288.Data != 0x72612d726568746f) {
switchD_00146591_caseD_1:
      bVar1 = llbuild::buildsystem::ExternalCommand::configureAttribute
                        (&this->super_ExternalCommand,ctx,name,value);
      return bVar1;
    }
    local_240.twine = (Twine *)local_230;
    local_238 = 0x2000000000;
    Separator_01.Length = 1;
    Separator_01.Data = " ";
    llvm::StringRef::split
              ((StringRef *)local_2a8,(SmallVectorImpl<llvm::StringRef> *)&local_240,Separator_01,-1
               ,false);
    local_2a8._0_8_ = (char *)0x0;
    local_2a8._8_8_ = 0;
    local_298 = (pointer)0x0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<llvm::StringRef*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_2a8,
               local_240.twine,&(local_240.twine)->LHS + (local_238 & 0xffffffff) * 2);
    pvVar2 = &this->otherArgs;
  }
  this_01 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_2a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(pvVar2,this_01);
LAB_00146b16:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(this_01);
  if (&(local_240.twine)->LHS != local_230) {
    free(local_240.twine);
  }
  return true;
}

Assistant:

virtual bool configureAttribute(const ConfigureContext& ctx, StringRef name,
                                  StringRef value) override {
    if (name == "executable") {
      executable = value;
    } else if (name == "module-name") {
      moduleName = value;
    } else if (name == "module-output-path") {
      moduleOutputPath = value;
    } else if (name == "sources") {
      SmallVector<StringRef, 32> sources;
      StringRef(value).split(sources, " ", /*MaxSplit=*/-1,
                             /*KeepEmpty=*/false);
      sourcesList = std::vector<std::string>(sources.begin(), sources.end());
    } else if (name == "objects") {
      SmallVector<StringRef, 32> objects;
      StringRef(value).split(objects, " ", /*MaxSplit=*/-1,
                             /*KeepEmpty=*/false);
      objectsList = std::vector<std::string>(objects.begin(), objects.end());
    } else if (name == "import-paths") {
      SmallVector<StringRef, 32> imports;
      StringRef(value).split(imports, " ", /*MaxSplit=*/-1,
                             /*KeepEmpty=*/false);
      importPaths = std::vector<std::string>(imports.begin(), imports.end());
    } else if (name == "temps-path") {
      tempsPath = value;
    } else if (name == "is-library") {
      if (!configureBool(ctx, isLibrary, name, value))
        return false;
    } else if (name == "enable-whole-module-optimization") {
      if (!configureBool(ctx, enableWholeModuleOptimization, name, value))
        return false;
    } else if (name == "num-threads") {
      int numThreadsInt = 0;
      if (value.getAsInteger(10, numThreadsInt)) {
        ctx.error("'" + name + "' should be an int.");
        return false;
      }
      if (numThreadsInt < 0) {
        ctx.error("'" + name + "' should be greater than or equal to zero.");
        return false;
      }
      numThreads = value;
    } else if (name == "other-args") {
      SmallVector<StringRef, 32> args;
      StringRef(value).split(args, " ", /*MaxSplit=*/-1,
                             /*KeepEmpty=*/false);
      otherArgs = std::vector<std::string>(args.begin(), args.end());
    } else {
      return ExternalCommand::configureAttribute(ctx, name, value);
    }

    return true;
  }